

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O2

double Js::DateImplementation::DateFncUTC(ScriptContext *scriptContext,Arguments *args)

{
  bool bVar1;
  Type TVar2;
  Var aValue;
  ulong uVar3;
  double dVar4;
  double local_78 [8];
  double local_38;
  
  TVar2 = args->Info;
  if (((ulong)TVar2 & 0xfffffe) != 0) {
    uVar3 = 0;
    while ((uVar3 < 7 && (uVar3 < (TVar2._0_4_ & 0xffffff) - 1))) {
      aValue = Arguments::operator[](args,(int)(uVar3 + 1));
      dVar4 = JavascriptConversion::ToNumber(aValue,scriptContext);
      local_78[uVar3] = dVar4;
      TVar2 = args->Info;
      uVar3 = uVar3 + 1;
    }
    for (uVar3 = 0; uVar3 != 7; uVar3 = uVar3 + 1) {
      if (uVar3 < (*(uint *)&args->Info & 0xffffff) - 1) {
        local_38 = local_78[uVar3];
        bVar1 = NumberUtilities::IsFinite(local_38);
        if (!bVar1) {
          return NAN;
        }
        dVar4 = ConvertToInteger(local_38);
      }
      else {
        dVar4 = 1.0;
        if (uVar3 != 2) {
          dVar4 = 0.0;
        }
      }
      local_78[uVar3] = dVar4;
    }
    dVar4 = DateUtilities::TvFromDate
                      ((double)(~-(ulong)(local_78[0] < 100.0) & (ulong)local_78[0] |
                               (~-(ulong)(0.0 <= local_78[0]) & (ulong)local_78[0] |
                               (ulong)(local_78[0] + 1900.0) & -(ulong)(0.0 <= local_78[0])) &
                               -(ulong)(local_78[0] < 100.0)),local_78[1],local_78[2] + -1.0,
                       local_78[5] * 1000.0 + local_78[3] * 3600000.0 + local_78[4] * 60000.0 +
                       local_78[6]);
    if (ABS(dVar4) <= 8.64e+15) {
      return dVar4;
    }
  }
  return NAN;
}

Assistant:

double DateImplementation::DateFncUTC(ScriptContext* scriptContext, Arguments args)
    {
        const int kcvarMax = 7;
        double rgdbl[kcvarMax];
        double tv;
        double dblT;
        uint ivar;

        // See: https://github.com/Microsoft/ChakraCore/issues/1665
        // Date.UTC should return NaN with 0 arguments.
        // args.Info.Count includes an implicit first parameter, so we check for Count <= 1.
        if (args.Info.Count <= 1)
        {
            return JavascriptNumber::NaN;
        }

        for (ivar = 0; (ivar < (args.Info.Count-1)) && ivar < kcvarMax; ++ivar)
        {
            rgdbl[ivar] = JavascriptConversion::ToNumber(args[ivar+1],scriptContext);

        }
        for (ivar = 0; ivar < kcvarMax; ivar++)
        {
            // Unspecified parameters are treated like zero, except date, which
            // is treated as 1.
            if (ivar >= (args.Info.Count - 1))
            {
                rgdbl[ivar] = (ivar == 2);
                continue;
            }
#pragma prefast(suppress:6001, "rgdbl index ivar < args.Info.Count - 1 are initialized")
            dblT = rgdbl[ivar];
            if (!Js::NumberUtilities::IsFinite(dblT))
            {
                return JavascriptNumber::NaN;
            }
            rgdbl[ivar] = ConvertToInteger(dblT);
        }

        // adjust the year
        if (rgdbl[0] < 100 && rgdbl[0] >= 0)
        {
            rgdbl[0] += 1900;
        }

        // Get the UTC time value.
        tv = TvFromDate(rgdbl[0], rgdbl[1], rgdbl[2] - 1,
            rgdbl[3] * 3600000 + rgdbl[4] * 60000 + rgdbl[5] * 1000 + rgdbl[6]);

        if (tv < ktvMin || tv > ktvMax)
        {
            return JavascriptNumber::NaN;
        }
        else
        {
            return tv;
        }
    }